

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandCaseStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandCaseStatement,std::span<slang::ast::RandCaseStatement::Item,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,
          span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  SourceRange sourceRange;
  span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> items;
  RandCaseStatement *pRVar1;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL> *in_stack_ffffffffffffffd0
  ;
  SourceLocation in_stack_ffffffffffffffd8;
  SourceLocation in_stack_ffffffffffffffe0;
  
  pRVar1 = (RandCaseStatement *)
           allocate((BumpAllocator *)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
                    (size_t)in_stack_ffffffffffffffc8);
  std::span<const_slang::ast::RandCaseStatement::Item,_18446744073709551615UL>::
  span<slang::ast::RandCaseStatement::Item,_18446744073709551615UL>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  items._M_extent._M_extent_value = in_RSI._M_extent_value;
  items._M_ptr = in_RDX;
  sourceRange.endLoc = in_stack_ffffffffffffffe0;
  sourceRange.startLoc = in_stack_ffffffffffffffd8;
  ast::RandCaseStatement::RandCaseStatement
            ((RandCaseStatement *)(in_RDX->stmt).ptr,items,sourceRange);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }